

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour_correspondence.hpp
# Opt level: O3

tuple<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
* eos::fitting::get_contour_correspondences
            (tuple<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
             *__return_storage_ptr__,LandmarkCollection<Eigen::Vector2f> *landmarks,
            ContourLandmarks *contour_landmarks,ModelContour *model_contour,float yaw_angle,
            Mesh *mesh,Matrix4f *view_model,Matrix4f *ortho_projection,Vector4f *viewport,
            float frontal_range_threshold)

{
  vector<int,_std::allocator<int>_> model_contour_indices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  landmark_contour_identifiers;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
  local_70;
  undefined1 *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  model_contour_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  model_contour_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  model_contour_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  landmark_contour_identifiers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  landmark_contour_identifiers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  landmark_contour_identifiers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  select_contour_abi_cxx11_
            (&local_70,(fitting *)contour_landmarks,yaw_angle,(ContourLandmarks *)model_contour,
             model_contour,frontal_range_threshold);
  local_38 = &landmark_contour_identifiers;
  local_40 = (undefined1 *)&model_contour_indices;
  std::
  tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<int,std::allocator<int>>&>
  ::operator=((tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<int,std::allocator<int>>&>
               *)&local_40,&local_70);
  if (local_70.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70.first);
  get_nearest_contour_correspondences
            (__return_storage_ptr__,landmarks,&landmark_contour_identifiers,&model_contour_indices,
             mesh,view_model,ortho_projection,viewport);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&landmark_contour_identifiers);
  if (model_contour_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(model_contour_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)model_contour_indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)model_contour_indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::tuple<std::vector<Eigen::Vector2f>, std::vector<Eigen::Vector4f>, std::vector<int>>
get_contour_correspondences(const core::LandmarkCollection<Eigen::Vector2f>& landmarks,
                            const ContourLandmarks& contour_landmarks, const ModelContour& model_contour,
                            float yaw_angle, const core::Mesh& mesh, const Eigen::Matrix4f& view_model,
                            const Eigen::Matrix4f& ortho_projection, const Eigen::Vector4f& viewport,
                            float frontal_range_threshold = 7.5f)
{
    // Select which side of the contour we'll use:
    std::vector<int> model_contour_indices;
    std::vector<std::string> landmark_contour_identifiers;
    std::tie(landmark_contour_identifiers, model_contour_indices) =
        select_contour(yaw_angle, contour_landmarks, model_contour, frontal_range_threshold);

    // For each 2D contour landmark, get the corresponding 3D vertex point and vertex id:
    // Note/Todo: Loop here instead of calling this function where we have no idea what it's doing? What does
    // its documentation say?
    return get_nearest_contour_correspondences(landmarks, landmark_contour_identifiers, model_contour_indices,
                                               mesh, view_model, ortho_projection, viewport);
}